

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeGenerator.cpp
# Opt level: O2

void __thiscall ByteCodeGenerator::PushScope(ByteCodeGenerator *this,Scope *innerScope)

{
  uint16 *puVar1;
  code *pcVar2;
  bool bVar3;
  undefined4 *puVar4;
  
  if (innerScope == (Scope *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar4 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeGenerator.cpp"
                       ,0x64b,"(innerScope != nullptr)","innerScope != nullptr");
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar4 = 0;
  }
  Scope::SetEnclosingScope(innerScope,this->currentScope);
  this->currentScope = innerScope;
  if ((innerScope->field_0x44 & 1) != 0) {
    this->dynamicScopeCount = this->dynamicScopeCount + 1;
  }
  if ((this->trackEnvDepth == true) && ((innerScope->field_0x44 & 0x10) != 0)) {
    puVar1 = &this->envDepth;
    *puVar1 = *puVar1 + 1;
    if (*puVar1 == 0) {
      Js::Throw::OutOfMemory();
    }
  }
  return;
}

Assistant:

void ByteCodeGenerator::PushScope(Scope *innerScope)
{
    Assert(innerScope != nullptr);

    innerScope->SetEnclosingScope(currentScope);

    currentScope = innerScope;

    if (currentScope->GetIsDynamic())
    {
        this->dynamicScopeCount++;
    }

    if (this->trackEnvDepth && currentScope->GetMustInstantiate())
    {
        this->envDepth++;
        if (this->envDepth == 0)
        {
            Js::Throw::OutOfMemory();
        }
    }
}